

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_event_thread.c
# Opt level: O1

void ares_event_process_updates(ares_event_thread_t *e)

{
  ares_bool_t aVar1;
  ares_llist_node_t *node;
  ares_event_t *arg;
  ares_event_t *paVar2;
  ares_llist_t *list;
  
  list = e->ev_updates;
  do {
    node = ares_llist_node_first(list);
    if (node == (ares_llist_node_t *)0x0) {
      return;
    }
    arg = (ares_event_t *)ares_llist_node_claim(node);
    if (arg->fd == -1) {
      paVar2 = (ares_event_t *)ares_htable_vpvp_get_direct(e->ev_cust_handles,arg->data);
    }
    else {
      paVar2 = (ares_event_t *)ares_htable_asvp_get_direct(e->ev_sock_handles,arg->fd);
    }
    if (paVar2 == (ares_event_t *)0x0) {
      arg->e = e;
      if (arg->flags != ARES_EVENT_FLAG_NONE) {
        aVar1 = (*e->ev_sys->event_add)(arg);
        if (aVar1 != ARES_FALSE) {
          if (arg->fd == -1) {
            ares_htable_vpvp_insert(e->ev_cust_handles,arg->data,arg);
          }
          else {
            ares_htable_asvp_insert(e->ev_sock_handles,arg->fd,arg);
          }
          goto LAB_0011d93e;
        }
      }
      arg->e = (ares_event_thread_t *)0x0;
      ares_event_destroy_cb(arg);
    }
    else {
      if (arg->flags == ARES_EVENT_FLAG_NONE) {
        if (arg->fd == -1) {
          ares_htable_vpvp_remove(e->ev_cust_handles,arg->data);
        }
        else {
          ares_htable_asvp_remove(e->ev_sock_handles,arg->fd);
        }
      }
      else {
        (*e->ev_sys->event_mod)(paVar2,arg->flags);
        paVar2->flags = arg->flags;
      }
      ares_free(arg);
    }
LAB_0011d93e:
    list = e->ev_updates;
  } while( true );
}

Assistant:

static void ares_event_process_updates(ares_event_thread_t *e)
{
  ares_llist_node_t *node;

  /* Iterate across all updates and apply to internal list, removing from update
   * list */
  while ((node = ares_llist_node_first(e->ev_updates)) != NULL) {
    ares_event_t *newev = ares_llist_node_claim(node);
    ares_event_t *oldev;

    if (newev->fd == ARES_SOCKET_BAD) {
      oldev = ares_htable_vpvp_get_direct(e->ev_cust_handles, newev->data);
    } else {
      oldev = ares_htable_asvp_get_direct(e->ev_sock_handles, newev->fd);
    }

    /* Adding new */
    if (oldev == NULL) {
      newev->e = e;
      /* Don't try to add a new event if all flags are cleared, that's basically
       * someone trying to delete something already deleted.  Also if it fails
       * to add, cleanup. */
      if (newev->flags == ARES_EVENT_FLAG_NONE ||
          !e->ev_sys->event_add(newev)) {
        newev->e = NULL;
        ares_event_destroy_cb(newev);
      } else {
        if (newev->fd == ARES_SOCKET_BAD) {
          ares_htable_vpvp_insert(e->ev_cust_handles, newev->data, newev);
        } else {
          ares_htable_asvp_insert(e->ev_sock_handles, newev->fd, newev);
        }
      }
      continue;
    }

    /* Removal request */
    if (newev->flags == ARES_EVENT_FLAG_NONE) {
      /* the callback for the removal will call e->ev_sys->event_del(e, event)
       */
      if (newev->fd == ARES_SOCKET_BAD) {
        ares_htable_vpvp_remove(e->ev_cust_handles, newev->data);
      } else {
        ares_htable_asvp_remove(e->ev_sock_handles, newev->fd);
      }
      ares_free(newev);
      continue;
    }

    /* Modify request -- only flags can be changed */
    e->ev_sys->event_mod(oldev, newev->flags);
    oldev->flags = newev->flags;
    ares_free(newev);
  }
}